

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

wchar_t assertion_equal_wstring
                  (char *file,wchar_t line,wchar_t *v1,char *e1,wchar_t *v2,char *e2,void *extra)

{
  int iVar1;
  undefined8 in_RCX;
  wchar_t *in_RDX;
  wchar_t in_ESI;
  char *in_RDI;
  wchar_t *in_R8;
  wchar_t *in_R9;
  wchar_t local_4;
  
  assertion_count(in_RDI,in_ESI);
  if (in_RDX == in_R8) {
    local_4 = L'\x01';
  }
  else {
    if (((in_RDX != (wchar_t *)0x0) && (in_R8 != (wchar_t *)0x0)) &&
       (iVar1 = wcscmp(in_RDX,in_R8), iVar1 == 0)) {
      return L'\x01';
    }
    failure_start(in_RDI,(wchar_t)(ulong)(uint)in_ESI,"%s != %s",in_RCX,in_R9);
    wcsdump((char *)in_R8,in_R9);
    wcsdump((char *)in_R8,in_R9);
    failure_finish((void *)0x105f8e);
    local_4 = L'\0';
  }
  return local_4;
}

Assistant:

int
assertion_equal_wstring(const char *file, int line,
    const wchar_t *v1, const char *e1,
    const wchar_t *v2, const char *e2,
    void *extra)
{
	assertion_count(file, line);
	if (v1 == v2)
		return (1);
	if (v1 != NULL && v2 != NULL && wcscmp(v1, v2) == 0)
		return (1);
	failure_start(file, line, "%s != %s", e1, e2);
	wcsdump(e1, v1);
	wcsdump(e2, v2);
	failure_finish(extra);
	return (0);
}